

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O0

string * __thiscall google::protobuf::util::Status::ToString_abi_cxx11_(Status *this)

{
  ulong uVar1;
  int *in_RSI;
  string *in_RDI;
  Code in_stack_0000002c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  allocator *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48 [55];
  allocator local_11 [17];
  
  if (*in_RSI == 0) {
    paVar2 = local_11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"OK",paVar2);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  else {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      __rhs = &local_68;
      util::error::CodeEnumToString_abi_cxx11_(in_stack_0000002c);
      std::operator+(in_stack_ffffffffffffff78,(char *)__rhs);
      std::operator+(in_stack_ffffffffffffff78,__rhs);
      std::__cxx11::string::~string(local_48);
      std::__cxx11::string::~string((string *)&local_68);
    }
    else {
      util::error::CodeEnumToString_abi_cxx11_(in_stack_0000002c);
    }
  }
  return in_RDI;
}

Assistant:

string Status::ToString() const {
  if (error_code_ == error::OK) {
    return "OK";
  } else {
    if (error_message_.empty()) {
      return error::CodeEnumToString(error_code_);
    } else {
      return error::CodeEnumToString(error_code_) + ":" +
          error_message_;
    }
  }
}